

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<char_const(&)[10],capnp::Text::Reader,kj::StringPtr&,char_const*>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [10],Reader *params_1,
          StringPtr *params_2,char **params_3)

{
  char *__s;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  kj *local_40;
  char *local_38;
  
  local_38 = (char *)strlen((char *)this);
  local_50.ptr = *(char **)*params;
  local_50.size_ = *(long *)(*params + 8) - 1;
  local_60.ptr = (params_1->super_StringPtr).content.ptr;
  local_60.size_ = (params_1->super_StringPtr).content.size_ - 1;
  __s = (params_2->content).ptr;
  local_40 = this;
  local_70.size_ = strlen(__s);
  local_70.ptr = __s;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_40,&local_50,&local_60,&local_70,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}